

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpString.c
# Opt level: O1

void UpnpString_delete(UpnpString *p)

{
  SUpnpString *q;
  
  if (p != (UpnpString *)0x0) {
    *(undefined8 *)p = 0;
    free(*(void **)(p + 8));
    *(undefined8 *)(p + 8) = 0;
    free(p);
    return;
  }
  return;
}

Assistant:

void UpnpString_delete(UpnpString *p)
{
	struct SUpnpString *q = (struct SUpnpString *)p;

	if (!q)
		return;

	q->m_length = (size_t)0;

	free(q->m_string);
	q->m_string = NULL;

	free(p);
}